

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O3

void JsStandardPut(JsObject *self,char *prop,JsValue *val0,int flags)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  int pos;
  undefined1 local_58 [8];
  JsValue v;
  
  puVar1 = (undefined8 *)*self->sb;
  JsAssert((uint)(val0 != (JsValue *)0x0));
  JsLockup((JsLock)puVar1[2]);
  (*self->CanPut)(self,prop,(JsValue *)local_58);
  if (v.type != JS_UNDEFINED) {
    v.u.reference.name = (char *)JsMalloc(0x18);
    dVar2 = (val0->u).number;
    *(undefined8 *)v.u.reference.name = *(undefined8 *)val0;
    *(double *)((long)v.u.reference.name + 8) = dVar2;
    *(char **)((long)v.u.reference.name + 0x10) = (val0->u).reference.name;
    iVar3 = JsListSize((void *)*puVar1);
    if (0 < iVar3) {
      pos = 0;
      do {
        puVar5 = (undefined8 *)JsListGet((void *)*puVar1,pos);
        iVar4 = strcmp((char *)*puVar5,prop);
        if (iVar4 == 0) {
          puVar5[1] = v.u.reference.name;
          goto LAB_001051af;
        }
        pos = pos + 1;
      } while (iVar3 != pos);
    }
    puVar5 = (undefined8 *)JsMalloc(0x18);
    *puVar5 = prop;
    puVar5[1] = v.u.reference.name;
    *(int *)(puVar5 + 2) = flags;
    JsListPush((void *)*puVar1,puVar5);
  }
LAB_001051af:
  JsUnlock((JsLock)puVar1[2]);
  return;
}

Assistant:

void JsStandardPut(struct JsObject *self, char *prop, struct JsValue *val0, int flags){
	int i,size;
	struct JsProperty* p;
	struct JsStandardSelfBlock* sb;
	struct JsValue v;
	sb = (struct JsStandardSelfBlock*)self->sb[JS_STANDARD_OBJECT_FLOOR];
	JsAssert(val0 != NULL);
	JsLockup(sb->lock);
	(*self->CanPut)(self,prop,&v);
	if(v.u.boolean  == FALSE){
		JsUnlock(sb->lock);
		return;
	}
	//拷贝指针指向的内存
	struct JsValue* val = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	*val = *val0;
	size = JsListSize(sb->propertys);
	for(i=0;i<size;++i){
		p = (struct JsProperty*)JsListGet(sb->propertys,i);
		if(strcmp(p->name,prop) == 0){
			//发现同名属性, 则覆盖value. attr 不修改
			p->value = val;
			JsUnlock(sb->lock);
			return;
		}
	}
	//没有发现该属性, 则新添加一个新的属性
	p = (struct JsProperty*)JsMalloc(sizeof(struct JsProperty));
	p->name = prop;
	p->value = val;
	p->attr = flags;
	JsListPush(sb->propertys,p);
	JsUnlock(sb->lock);
	return;
}